

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreTexture.h
# Opt level: O0

void __thiscall
irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>::COpenGLCoreTexture
          (COpenGLCoreTexture<irr::video::COpenGLDriver> *this,path *name,
          array<irr::video::IImage_*> *images,E_TEXTURE_TYPE type,COpenGLDriver *driver)

{
  byte bVar1;
  bool bVar2;
  undefined4 uVar3;
  GLenum GVar4;
  ESetTextureActive EVar5;
  u32 uVar6;
  u32 uVar7;
  IImage *pIVar8;
  IImage **ppIVar9;
  void *pvVar10;
  COpenGLCacheHandler *pCVar11;
  STextureCache *this_00;
  ulong uVar12;
  undefined4 in_ECX;
  COpenGLCoreTexture<irr::video::COpenGLDriver> *in_RDX;
  long *in_RDI;
  long in_R8;
  double __x;
  u32 i_3;
  void *mipmapsData;
  u32 i_2;
  u32 i_1;
  COpenGLCoreTexture<irr::video::COpenGLDriver> *prevTexture;
  u32 i;
  array<irr::video::IImage_*> *tmpImages;
  undefined4 in_stack_ffffffffffffff48;
  E_TEXTURE_TYPE in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  uint uVar13;
  uint in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  ITexture *in_stack_ffffffffffffff60;
  IImage *in_stack_ffffffffffffff68;
  IImage *in_stack_ffffffffffffff70;
  IImage *in_stack_ffffffffffffff78;
  COpenGLCoreTexture<irr::video::COpenGLDriver> *in_stack_ffffffffffffff80;
  uint local_5c;
  uint local_50;
  uint local_4c;
  vector2d<int> local_3c;
  ESetTextureActive in_stack_ffffffffffffffcc;
  ESetTextureActive EVar14;
  u32 in_stack_ffffffffffffffe0;
  COpenGLCoreTexture<irr::video::COpenGLDriver> *this_01;
  
  IReferenceCounted::IReferenceCounted((IReferenceCounted *)(in_RDI + 0x1e));
  ITexture::ITexture(in_stack_ffffffffffffff60,
                     (void **)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                     (path *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff4c);
  *in_RDI = 0x43ce50;
  in_RDI[0x1e] = 0x43ce90;
  in_RDI[0xf] = in_R8;
  *(undefined4 *)(in_RDI + 0x10) = 0xde1;
  *(undefined4 *)((long)in_RDI + 0x84) = 0;
  *(undefined4 *)(in_RDI + 0x11) = 0x1908;
  *(undefined4 *)((long)in_RDI + 0x8c) = 0x1908;
  *(undefined4 *)(in_RDI + 0x12) = 0x1401;
  in_RDI[0x13] = 0;
  *(undefined1 *)(in_RDI + 0x14) = 0;
  in_RDI[0x15] = 0;
  *(undefined4 *)(in_RDI + 0x16) = 0;
  *(undefined1 *)((long)in_RDI + 0xb4) = 0;
  core::array<irr::video::IImage_*>::array
            ((array<irr::video::IImage_*> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  *(undefined1 *)(in_RDI + 0x1b) = 0;
  *(undefined1 *)((long)in_RDI + 0xd9) = 0;
  SStatesCache::SStatesCache((SStatesCache *)((long)in_RDI + 0xdc));
  uVar3 = (**(code **)(*(long *)in_RDI[0xf] + 0x2a0))();
  *(undefined4 *)(in_RDI + 0xb) = uVar3;
  GVar4 = TextureTypeIrrToGL((COpenGLCoreTexture<irr::video::COpenGLDriver> *)
                             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),ETT_2D);
  *(GLenum *)(in_RDI + 0x10) = GVar4;
  bVar1 = (**(code **)(*(long *)in_RDI[0xf] + 0x220))((long *)in_RDI[0xf],0x10);
  *(byte *)(in_RDI + 0xd) = bVar1 & 1;
  bVar1 = (**(code **)(*(long *)in_RDI[0xf] + 0x220))((long *)in_RDI[0xf],0x80);
  *(byte *)((long)in_RDI + 0xb4) = bVar1 & 1;
  core::array<irr::video::IImage_*>::operator[]
            ((array<irr::video::IImage_*> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),in_stack_ffffffffffffff4c
            );
  getImageValues(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if ((int)in_RDI[0x11] != 0) {
    this_01 = in_RDX;
    if ((((*(byte *)((long)in_RDI + 0xb4) & 1) != 0) ||
        (bVar2 = core::dimension2d<unsigned_int>::operator!=
                           ((dimension2d<unsigned_int> *)
                            CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            (dimension2d<unsigned_int> *)
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)), bVar2))
       || (*(int *)((long)in_RDI + 0x5c) != (int)in_RDI[0xc])) {
      core::array<irr::video::IImage_*>::size((array<irr::video::IImage_*> *)0x3456bb);
      core::array<irr::video::IImage_*>::set_used
                ((array<irr::video::IImage_*> *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff4c);
      EVar14 = EST_ACTIVE_ALWAYS;
      while (in_stack_ffffffffffffffcc = EVar14,
            EVar5 = core::array<irr::video::IImage_*>::size((array<irr::video::IImage_*> *)0x3456ea)
            , EVar14 < EVar5) {
        pIVar8 = (IImage *)
                 (**(code **)(*(long *)in_RDI[0xf] + 0x250))
                           ((long *)in_RDI[0xf],(int)in_RDI[0xc],in_RDI + 10);
        ppIVar9 = core::array<irr::video::IImage_*>::operator[]
                            ((array<irr::video::IImage_*> *)
                             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                             in_stack_ffffffffffffff4c);
        *ppIVar9 = pIVar8;
        ppIVar9 = core::array<irr::video::IImage_*>::operator[]
                            ((array<irr::video::IImage_*> *)
                             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                             in_stack_ffffffffffffff4c);
        IImage::getDimension(*ppIVar9);
        bVar2 = core::dimension2d<unsigned_int>::operator==
                          ((dimension2d<unsigned_int> *)in_stack_ffffffffffffff60,
                           (dimension2d<unsigned_int> *)
                           CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        if (bVar2) {
          ppIVar9 = core::array<irr::video::IImage_*>::operator[]
                              ((array<irr::video::IImage_*> *)
                               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                               in_stack_ffffffffffffff4c);
          in_stack_ffffffffffffff70 = *ppIVar9;
          ppIVar9 = core::array<irr::video::IImage_*>::operator[]
                              ((array<irr::video::IImage_*> *)
                               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                               in_stack_ffffffffffffff4c);
          pIVar8 = *ppIVar9;
          core::vector2d<int>::vector2d(&local_3c,0,0);
          (*in_stack_ffffffffffffff70->_vptr_IImage[7])(in_stack_ffffffffffffff70,pIVar8,&local_3c);
        }
        else {
          ppIVar9 = core::array<irr::video::IImage_*>::operator[]
                              ((array<irr::video::IImage_*> *)
                               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                               in_stack_ffffffffffffff4c);
          in_stack_ffffffffffffff68 = *ppIVar9;
          ppIVar9 = core::array<irr::video::IImage_*>::operator[]
                              ((array<irr::video::IImage_*> *)
                               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                               in_stack_ffffffffffffff4c);
          (*in_stack_ffffffffffffff68->_vptr_IImage[6])(in_stack_ffffffffffffff68,*ppIVar9);
        }
        core::array<irr::video::IImage_*>::operator[]
                  ((array<irr::video::IImage_*> *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   in_stack_ffffffffffffff4c);
        pvVar10 = IImage::getMipMapsData
                            (in_stack_ffffffffffffff68,
                             (u32)((ulong)in_stack_ffffffffffffff60 >> 0x20));
        if (pvVar10 != (void *)0x0) {
          bVar2 = core::dimension2d<unsigned_int>::operator==
                            ((dimension2d<unsigned_int> *)in_stack_ffffffffffffff60,
                             (dimension2d<unsigned_int> *)
                             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
          if ((bVar2) && (*(int *)((long)in_RDI + 0x5c) == (int)in_RDI[0xc])) {
            ppIVar9 = core::array<irr::video::IImage_*>::operator[]
                                ((array<irr::video::IImage_*> *)
                                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                 in_stack_ffffffffffffff4c);
            in_stack_ffffffffffffff60 = (ITexture *)*ppIVar9;
            core::array<irr::video::IImage_*>::operator[]
                      ((array<irr::video::IImage_*> *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       in_stack_ffffffffffffff4c);
            IImage::getMipMapsData
                      (in_stack_ffffffffffffff68,(u32)((ulong)in_stack_ffffffffffffff60 >> 0x20));
            IImage::setMipMapsData
                      (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                       SUB81((ulong)in_stack_ffffffffffffff60 >> 0x38,0));
          }
          else {
            os::Printer::log((Printer *)
                             "COpenGLCoreTexture: Can\'t handle format changes for mipmap data. Mipmap data dropped"
                             ,__x);
          }
        }
        EVar14 = in_stack_ffffffffffffffcc + EST_ACTIVE_ON_CHANGE;
      }
      in_RDX = (COpenGLCoreTexture<irr::video::COpenGLDriver> *)(in_RDI + 0x17);
    }
    (*GL.GenTextures)(1,(GLuint *)((long)in_RDI + 0x84));
    pCVar11 = COpenGLDriver::getCacheHandler((COpenGLDriver *)in_RDI[0xf]);
    this_00 = COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
              ::getTextureCache(&pCVar11->
                                 super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                               );
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::STextureCache::get(this_00,0);
    pCVar11 = COpenGLDriver::getCacheHandler((COpenGLDriver *)in_RDI[0xf]);
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::getTextureCache(&pCVar11->
                       super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                     );
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::STextureCache::set
              ((STextureCache *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
               (u32)((ulong)in_R8 >> 0x20),&in_RDX->super_ITexture,in_stack_ffffffffffffffcc);
    (*GL.TexParameteri)(*(GLenum *)(in_RDI + 0x10),0x2801,0x2600);
    (*GL.TexParameteri)(*(GLenum *)(in_RDI + 0x10),0x2800,0x2600);
    if ((*(byte *)(in_RDI + 0xd) & 1) != 0) {
      uVar12 = (**(code **)(*(long *)in_RDI[0xf] + 0x220))((long *)in_RDI[0xf],8);
      if ((uVar12 & 1) == 0) {
        uVar12 = (**(code **)(*(long *)in_RDI[0xf] + 0x220))((long *)in_RDI[0xf],4);
        if ((uVar12 & 1) == 0) {
          (*GL.Hint)(0x8192,0x1100);
        }
        else {
          (*GL.Hint)(0x8192,0x1102);
        }
      }
      else {
        (*GL.Hint)(0x8192,0x1101);
      }
    }
    local_4c = 0;
    while (uVar13 = local_4c,
          uVar6 = core::array<irr::video::IImage_*>::size((array<irr::video::IImage_*> *)0x345a4f),
          uVar13 < uVar6) {
      ppIVar9 = core::array<irr::video::IImage_*>::operator[]
                          ((array<irr::video::IImage_*> *)
                           CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                           in_stack_ffffffffffffff4c);
      IImage::getData(*ppIVar9);
      uploadTexture(this_01,SUB41((uint)in_ECX >> 0x18,0),in_stack_ffffffffffffffe0,
                    (u32)((ulong)in_R8 >> 0x20),in_RDX);
      local_4c = local_4c + 1;
    }
    if (((*(byte *)(in_RDI + 0xd) & 1) != 0) && ((*(byte *)((long)in_RDI + 0xd9) & 1) == 0)) {
      local_50 = 0;
      while (in_stack_ffffffffffffff54 = local_50,
            uVar6 = core::array<irr::video::IImage_*>::size((array<irr::video::IImage_*> *)0x345ad5)
            , in_stack_ffffffffffffff54 < uVar6) {
        core::array<irr::video::IImage_*>::operator[]
                  ((array<irr::video::IImage_*> *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   in_stack_ffffffffffffff4c);
        pvVar10 = IImage::getMipMapsData
                            (in_stack_ffffffffffffff68,
                             (u32)((ulong)in_stack_ffffffffffffff60 >> 0x20));
        (**(code **)(*in_RDI + 0x10))(in_RDI,pvVar10,local_50);
        local_50 = local_50 + 1;
      }
    }
    uVar6 = (u32)((ulong)in_R8 >> 0x20);
    if ((*(byte *)((long)in_RDI + 0xb4) & 1) == 0) {
      local_5c = 0;
      while( true ) {
        uVar13 = local_5c;
        uVar7 = core::array<irr::video::IImage_*>::size((array<irr::video::IImage_*> *)0x345b54);
        uVar6 = (u32)((ulong)in_R8 >> 0x20);
        if (uVar7 <= uVar13) break;
        core::array<irr::video::IImage_*>::operator[]
                  ((array<irr::video::IImage_*> *)CONCAT44(in_stack_ffffffffffffff54,uVar13),
                   in_stack_ffffffffffffff4c);
        IReferenceCounted::drop
                  ((IReferenceCounted *)
                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        local_5c = local_5c + 1;
      }
      core::array<irr::video::IImage_*>::clear
                ((array<irr::video::IImage_*> *)in_stack_ffffffffffffff60);
    }
    pCVar11 = COpenGLDriver::getCacheHandler((COpenGLDriver *)in_RDI[0xf]);
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::getTextureCache(&pCVar11->
                       super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                     );
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::STextureCache::set
              ((STextureCache *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),uVar6,
               &in_RDX->super_ITexture,in_stack_ffffffffffffffcc);
    COpenGLDriver::testGLError((COpenGLDriver *)in_RDI[0xf],0x7f);
  }
  return;
}

Assistant:

COpenGLCoreTexture(const io::path &name, const core::array<IImage *> &images, E_TEXTURE_TYPE type, TOpenGLDriver *driver) :
			ITexture(name, type), Driver(driver), TextureType(GL_TEXTURE_2D),
			TextureName(0), InternalFormat(GL_RGBA), PixelFormat(GL_RGBA), PixelType(GL_UNSIGNED_BYTE), Converter(0), LockReadOnly(false), LockImage(0), LockLayer(0),
			KeepImage(false), MipLevelStored(0), LegacyAutoGenerateMipMaps(false)
	{
		_IRR_DEBUG_BREAK_IF(images.size() == 0)

		DriverType = Driver->getDriverType();
		TextureType = TextureTypeIrrToGL(Type);
		HasMipMaps = Driver->getTextureCreationFlag(ETCF_CREATE_MIP_MAPS);
		KeepImage = Driver->getTextureCreationFlag(ETCF_ALLOW_MEMORY_COPY);

		getImageValues(images[0]);
		if (!InternalFormat)
			return;

		const core::array<IImage *> *tmpImages = &images;

		if (KeepImage || OriginalSize != Size || OriginalColorFormat != ColorFormat) {
			Images.set_used(images.size());

			for (u32 i = 0; i < images.size(); ++i) {
				Images[i] = Driver->createImage(ColorFormat, Size);

				if (images[i]->getDimension() == Size)
					images[i]->copyTo(Images[i]);
				else
					images[i]->copyToScaling(Images[i]);

				if (images[i]->getMipMapsData()) {
					if (OriginalSize == Size && OriginalColorFormat == ColorFormat) {
						Images[i]->setMipMapsData(images[i]->getMipMapsData(), false);
					} else {
						// TODO: handle at least mipmap with changing color format
						os::Printer::log("COpenGLCoreTexture: Can't handle format changes for mipmap data. Mipmap data dropped", ELL_WARNING);
					}
				}
			}

			tmpImages = &Images;
		}

		GL.GenTextures(1, &TextureName);

		const COpenGLCoreTexture *prevTexture = Driver->getCacheHandler()->getTextureCache().get(0);
		Driver->getCacheHandler()->getTextureCache().set(0, this);

		GL.TexParameteri(TextureType, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		GL.TexParameteri(TextureType, GL_TEXTURE_MAG_FILTER, GL_NEAREST);

#ifdef GL_GENERATE_MIPMAP_HINT
		if (HasMipMaps) {
			if (Driver->getTextureCreationFlag(ETCF_OPTIMIZED_FOR_SPEED))
				GL.Hint(GL_GENERATE_MIPMAP_HINT, GL_FASTEST);
			else if (Driver->getTextureCreationFlag(ETCF_OPTIMIZED_FOR_QUALITY))
				GL.Hint(GL_GENERATE_MIPMAP_HINT, GL_NICEST);
			else
				GL.Hint(GL_GENERATE_MIPMAP_HINT, GL_DONT_CARE);
		}
#endif

		for (u32 i = 0; i < (*tmpImages).size(); ++i)
			uploadTexture(true, i, 0, (*tmpImages)[i]->getData());

		if (HasMipMaps && !LegacyAutoGenerateMipMaps) {
			// Create mipmaps (either from image mipmaps or generate them)
			for (u32 i = 0; i < (*tmpImages).size(); ++i) {
				void *mipmapsData = (*tmpImages)[i]->getMipMapsData();
				regenerateMipMapLevels(mipmapsData, i);
			}
		}

		if (!KeepImage) {
			for (u32 i = 0; i < Images.size(); ++i)
				Images[i]->drop();

			Images.clear();
		}

		Driver->getCacheHandler()->getTextureCache().set(0, prevTexture);

		Driver->testGLError(__LINE__);
	}